

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O0

void __thiscall
tchecker::algorithms::couvscc::
generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::merge_scc
          (generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>
           *this,node_sptr_t *n,stats_t *stats,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels)

{
  uint uVar1;
  bool bVar2;
  size_type num_bits;
  reference pvVar3;
  bool *pbVar4;
  node_t *pnVar5;
  uint *puVar6;
  value_type local_98;
  undefined4 local_6c;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  local_68;
  node_sptr_t u;
  allocator<unsigned_long> local_49;
  undefined1 local_48 [8];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> scc_labels;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels_local;
  stats_t *stats_local;
  node_sptr_t *n_local;
  generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>
  *this_local;
  
  scc_labels.m_num_bits = (size_type)labels;
  num_bits = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(labels);
  std::allocator<unsigned_long>::allocator(&local_49);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,num_bits,0,
             &local_49);
  std::allocator<unsigned_long>::~allocator(&local_49);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t
            (&local_68,
             (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
              *)0x0);
  while( true ) {
    pvVar3 = std::
             stack<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>_>
             ::top(&this->_roots);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
    ::operator=(&local_68,&pvVar3->n);
    pvVar3 = std::
             stack<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>_>
             ::top(&this->_roots);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator|=
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
               &pvVar3->labels);
    bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::none
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                       scc_labels.m_num_bits);
    if ((!bVar2) &&
       (bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           scc_labels.m_num_bits,
                           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_48
                          ), bVar2)) break;
    std::
    stack<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>_>
    ::pop(&this->_roots);
    pnVar5 = (node_t *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
             ::operator->(&local_68);
    puVar6 = couvscc::node_t::dfsnum(pnVar5);
    uVar1 = *puVar6;
    pnVar5 = (node_t *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
             ::operator->(n);
    puVar6 = couvscc::node_t::dfsnum(pnVar5);
    if (uVar1 <= *puVar6) {
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::intrusive_shared_ptr_t(&local_98.n,&local_68);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_98.labels,
                 (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
      std::
      stack<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>_>
      ::push(&this->_roots,&local_98);
      roots_stack_entry_t::~roots_stack_entry_t(&local_98);
      local_6c = 0;
LAB_00146e30:
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_68);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
      return;
    }
  }
  pbVar4 = stats_t::cycle(stats);
  *pbVar4 = true;
  local_6c = 1;
  goto LAB_00146e30;
}

Assistant:

void merge_scc(node_sptr_t & n, tchecker::algorithms::couvscc::stats_t & stats, boost::dynamic_bitset<> const & labels)
  {
    boost::dynamic_bitset<> scc_labels{labels.size(), 0};
    node_sptr_t u{nullptr};
    do {
      u = _roots.top().n;
      scc_labels |= _roots.top().labels;
      if (!labels.none() && labels.is_subset_of(scc_labels)) {
        stats.cycle() = true;
        return;
      }
      _roots.pop();
    } while (u->dfsnum() > n->dfsnum());
    _roots.push(roots_stack_entry_t{u, scc_labels});
  }